

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::double_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,double_writer *f)

{
  wchar_t wVar1;
  size_t sVar2;
  undefined8 *puVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  wchar_t __tmp;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  basic_buffer<wchar_t> *c;
  size_t size;
  int *piVar16;
  int iVar22;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  uVar12 = (ulong)spec->width_;
  sVar2 = f->buffer->size_;
  uVar11 = (ulong)(f->sign != '\0');
  uVar9 = sVar2 + uVar11;
  puVar3 = *(undefined8 **)this;
  lVar8 = puVar3[2];
  uVar10 = uVar12 - uVar9;
  if (uVar12 < uVar9 || uVar10 == 0) {
    uVar9 = uVar9 + lVar8;
    if ((ulong)puVar3[3] < uVar9) {
      (**(code **)*puVar3)(puVar3,uVar9);
    }
    puVar3[2] = uVar9;
    piVar16 = (int *)(lVar8 * 4 + puVar3[1]);
    if (f->sign != '\0') {
      *piVar16 = (int)f->sign;
      piVar16 = piVar16 + 1;
      f->n = f->n - 1;
    }
    sVar2 = f->buffer->size_;
    if (0 < (long)sVar2) {
      pcVar14 = f->buffer->ptr_;
      lVar8 = sVar2 + 1;
      lVar13 = 0;
      do {
        piVar16[lVar13] = (int)pcVar14[lVar13];
        lVar8 = lVar8 + -1;
        lVar13 = lVar13 + 1;
      } while (1 < lVar8);
    }
  }
  else {
    uVar15 = lVar8 + uVar12;
    if ((ulong)puVar3[3] < uVar15) {
      (**(code **)*puVar3)(puVar3,uVar15);
    }
    puVar3[2] = uVar15;
    auVar7 = _DAT_002060a0;
    auVar6 = _DAT_00206090;
    auVar5 = _DAT_00206080;
    lVar13 = puVar3[1];
    piVar16 = (int *)(lVar13 + lVar8 * 4);
    wVar1 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar15 = uVar10 >> 1;
      if (1 < uVar10) {
        piVar16 = piVar16 + uVar15;
        uVar10 = uVar15 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar27._8_4_ = (int)uVar10;
        auVar27._0_8_ = uVar10;
        auVar27._12_4_ = (int)(uVar10 >> 0x20);
        lVar13 = lVar13 + lVar8 * 4;
        lVar8 = 0;
        auVar27 = auVar27 ^ _DAT_002060a0;
        do {
          auVar24._8_4_ = (int)lVar8;
          auVar24._0_8_ = lVar8;
          auVar24._12_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar28 = (auVar24 | auVar6) ^ auVar7;
          iVar22 = auVar27._4_4_;
          if ((bool)(~(auVar28._4_4_ == iVar22 && auVar27._0_4_ < auVar28._0_4_ ||
                      iVar22 < auVar28._4_4_) & 1)) {
            *(wchar_t *)(lVar13 + lVar8 * 4) = wVar1;
          }
          if ((auVar28._12_4_ != auVar27._12_4_ || auVar28._8_4_ <= auVar27._8_4_) &&
              auVar28._12_4_ <= auVar27._12_4_) {
            *(wchar_t *)(lVar13 + 4 + lVar8 * 4) = wVar1;
          }
          auVar24 = (auVar24 | auVar5) ^ auVar7;
          iVar29 = auVar24._4_4_;
          if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar24._0_4_ <= auVar27._0_4_)) {
            *(wchar_t *)(lVar13 + 8 + lVar8 * 4) = wVar1;
            *(wchar_t *)(lVar13 + 0xc + lVar8 * 4) = wVar1;
          }
          lVar8 = lVar8 + 4;
        } while ((uVar10 - ((uint)(uVar15 + 0x3fffffffffffffff) & 3)) + 4 != lVar8);
      }
      if (f->sign != '\0') {
        *piVar16 = (int)f->sign;
        piVar16 = piVar16 + 1;
        f->n = f->n - 1;
      }
      sVar4 = f->buffer->size_;
      if (0 < (long)sVar4) {
        pcVar14 = f->buffer->ptr_;
        lVar8 = sVar4 + 1;
        do {
          *piVar16 = (int)*pcVar14;
          pcVar14 = pcVar14 + 1;
          piVar16 = piVar16 + 1;
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
      auVar7 = _DAT_002060a0;
      auVar6 = _DAT_00206090;
      auVar5 = _DAT_00206080;
      if (uVar12 != uVar9) {
        uVar12 = (uVar12 * 4 + (sVar2 + uVar15 + uVar11) * -4) - 4;
        auVar28._8_4_ = (int)uVar12;
        auVar28._0_8_ = uVar12;
        auVar28._12_4_ = (int)(uVar12 >> 0x20);
        auVar19._0_8_ = uVar12 >> 2;
        auVar19._8_8_ = auVar28._8_8_ >> 2;
        uVar9 = 0;
        auVar19 = auVar19 ^ _DAT_002060a0;
        do {
          auVar25._8_4_ = (int)uVar9;
          auVar25._0_8_ = uVar9;
          auVar25._12_4_ = (int)(uVar9 >> 0x20);
          auVar27 = (auVar25 | auVar6) ^ auVar7;
          iVar22 = auVar19._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar22 && auVar19._0_4_ < auVar27._0_4_ ||
                      iVar22 < auVar27._4_4_) & 1)) {
            piVar16[uVar9] = wVar1;
          }
          if ((auVar27._12_4_ != auVar19._12_4_ || auVar27._8_4_ <= auVar19._8_4_) &&
              auVar27._12_4_ <= auVar19._12_4_) {
            piVar16[uVar9 + 1] = wVar1;
          }
          auVar27 = (auVar25 | auVar5) ^ auVar7;
          iVar29 = auVar27._4_4_;
          if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar27._0_4_ <= auVar19._0_4_)) {
            piVar16[uVar9 + 2] = wVar1;
            piVar16[uVar9 + 3] = wVar1;
          }
          uVar9 = uVar9 + 4;
        } while (((uVar12 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar12 != uVar9) {
        piVar16 = piVar16 + uVar10;
        uVar9 = (uVar12 * 4 + uVar9 * -4) - 4;
        auVar17._8_4_ = (int)uVar9;
        auVar17._0_8_ = uVar9;
        auVar17._12_4_ = (int)(uVar9 >> 0x20);
        auVar18._0_8_ = uVar9 >> 2;
        auVar18._8_8_ = auVar17._8_8_ >> 2;
        lVar13 = lVar13 + lVar8 * 4;
        uVar12 = 0;
        auVar18 = auVar18 ^ _DAT_002060a0;
        do {
          auVar23._8_4_ = (int)uVar12;
          auVar23._0_8_ = uVar12;
          auVar23._12_4_ = (int)(uVar12 >> 0x20);
          auVar27 = (auVar23 | auVar6) ^ auVar7;
          iVar22 = auVar18._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar22 && auVar18._0_4_ < auVar27._0_4_ ||
                      iVar22 < auVar27._4_4_) & 1)) {
            *(wchar_t *)(lVar13 + uVar12 * 4) = wVar1;
          }
          if ((auVar27._12_4_ != auVar18._12_4_ || auVar27._8_4_ <= auVar18._8_4_) &&
              auVar27._12_4_ <= auVar18._12_4_) {
            *(wchar_t *)(lVar13 + 4 + uVar12 * 4) = wVar1;
          }
          auVar27 = (auVar23 | auVar5) ^ auVar7;
          iVar29 = auVar27._4_4_;
          if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar27._0_4_ <= auVar18._0_4_)) {
            *(wchar_t *)(lVar13 + 8 + uVar12 * 4) = wVar1;
            *(wchar_t *)(lVar13 + 0xc + uVar12 * 4) = wVar1;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar9 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      }
      if (f->sign != '\0') {
        *piVar16 = (int)f->sign;
        piVar16 = piVar16 + 1;
        f->n = f->n - 1;
      }
      sVar2 = f->buffer->size_;
      if (0 < (long)sVar2) {
        pcVar14 = f->buffer->ptr_;
        lVar8 = sVar2 + 1;
        lVar13 = 0;
        do {
          piVar16[lVar13] = (int)pcVar14[lVar13];
          lVar8 = lVar8 + -1;
          lVar13 = lVar13 + 1;
        } while (1 < lVar8);
      }
    }
    else {
      if (f->sign != '\0') {
        *piVar16 = (int)f->sign;
        piVar16 = piVar16 + 1;
        f->n = f->n - 1;
      }
      sVar2 = f->buffer->size_;
      if (0 < (long)sVar2) {
        pcVar14 = f->buffer->ptr_;
        lVar8 = sVar2 + 1;
        do {
          *piVar16 = (int)*pcVar14;
          pcVar14 = pcVar14 + 1;
          piVar16 = piVar16 + 1;
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
      auVar7 = _DAT_002060a0;
      auVar6 = _DAT_00206090;
      auVar5 = _DAT_00206080;
      if (uVar12 != uVar9) {
        uVar12 = (uVar12 * 4 + uVar9 * -4) - 4;
        auVar20._8_4_ = (int)uVar12;
        auVar20._0_8_ = uVar12;
        auVar20._12_4_ = (int)(uVar12 >> 0x20);
        auVar21._0_8_ = uVar12 >> 2;
        auVar21._8_8_ = auVar20._8_8_ >> 2;
        uVar9 = 0;
        auVar21 = auVar21 ^ _DAT_002060a0;
        do {
          auVar26._8_4_ = (int)uVar9;
          auVar26._0_8_ = uVar9;
          auVar26._12_4_ = (int)(uVar9 >> 0x20);
          auVar27 = (auVar26 | auVar6) ^ auVar7;
          iVar22 = auVar21._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar22 && auVar21._0_4_ < auVar27._0_4_ ||
                      iVar22 < auVar27._4_4_) & 1)) {
            piVar16[uVar9] = wVar1;
          }
          if ((auVar27._12_4_ != auVar21._12_4_ || auVar27._8_4_ <= auVar21._8_4_) &&
              auVar27._12_4_ <= auVar21._12_4_) {
            piVar16[uVar9 + 1] = wVar1;
          }
          auVar27 = (auVar26 | auVar5) ^ auVar7;
          iVar29 = auVar27._4_4_;
          if (iVar29 <= iVar22 && (iVar29 != iVar22 || auVar27._0_4_ <= auVar21._0_4_)) {
            piVar16[uVar9 + 2] = wVar1;
            piVar16[uVar9 + 3] = wVar1;
          }
          uVar9 = uVar9 + 4;
        } while (((uVar12 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
      }
    }
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }